

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateCompiledContent
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRegexpPtr regexp,xmlNodePtr content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlRegExecCtxtPtr exec;
  xmlNode *pxVar4;
  xmlRelaxNGValidErr err;
  
  if (regexp == (xmlRegexpPtr)0x0) {
    return -1;
  }
  iVar1 = ctxt->perr;
  exec = xmlRegNewExecCtxt(regexp,xmlRelaxNGValidateCompiledCallback,ctxt);
  ctxt->perr = 0;
  if (content != (xmlNodePtr)0x0) {
    iVar3 = 0;
    do {
      ctxt->state->seq = content;
      if (content->type - XML_TEXT_NODE < 2) {
        iVar2 = xmlIsBlankNode(content);
        if (iVar2 == 0) {
          iVar3 = xmlRegExecPushString(exec,(xmlChar *)"#text",ctxt);
          if (iVar3 < 0) {
            err = XML_RELAXNG_ERR_TEXTWRONG;
            pxVar4 = content->parent;
LAB_0018c061:
            xmlRelaxNGAddValidError(ctxt,err,pxVar4->name,(xmlChar *)0x0,0);
          }
        }
      }
      else if (content->type == XML_ELEMENT_NODE) {
        if (content->ns == (xmlNs *)0x0) {
          iVar3 = xmlRegExecPushString(exec,content->name,ctxt);
        }
        else {
          iVar3 = xmlRegExecPushString2(exec,content->name,content->ns->href,ctxt);
        }
        if (iVar3 < 0) {
          err = XML_RELAXNG_ERR_ELEMWRONG;
          pxVar4 = content;
          goto LAB_0018c061;
        }
      }
    } while ((-1 < iVar3) && (content = content->next, content != (_xmlNode *)0x0));
  }
  iVar3 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
  if (iVar3 == 1) {
    ctxt->state->seq = (xmlNodePtr)0x0;
  }
  else if (iVar3 == 0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0);
    if ((ctxt->flags & 1) == 0) {
      xmlRelaxNGDumpValidError(ctxt);
    }
  }
  xmlRegFreeExecCtxt(exec);
  iVar2 = -1;
  if (iVar3 == 1) {
    iVar2 = ctxt->perr;
  }
  ctxt->perr = iVar1;
  return iVar2;
}

Assistant:

static int
xmlRelaxNGValidateCompiledContent(xmlRelaxNGValidCtxtPtr ctxt,
                                  xmlRegexpPtr regexp, xmlNodePtr content)
{
    xmlRegExecCtxtPtr exec;
    xmlNodePtr cur;
    int ret = 0;
    int oldperr;

    if ((ctxt == NULL) || (regexp == NULL))
        return (-1);
    oldperr = ctxt->perr;
    exec = xmlRegNewExecCtxt(regexp,
                             xmlRelaxNGValidateCompiledCallback, ctxt);
    ctxt->perr = 0;
    cur = content;
    while (cur != NULL) {
        ctxt->state->seq = cur;
        switch (cur->type) {
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
                if (xmlIsBlankNode(cur))
                    break;
                ret = xmlRegExecPushString(exec, BAD_CAST "#text", ctxt);
                if (ret < 0) {
                    VALID_ERR2(XML_RELAXNG_ERR_TEXTWRONG,
                               cur->parent->name);
                }
                break;
            case XML_ELEMENT_NODE:
                if (cur->ns != NULL) {
                    ret = xmlRegExecPushString2(exec, cur->name,
                                                cur->ns->href, ctxt);
                } else {
                    ret = xmlRegExecPushString(exec, cur->name, ctxt);
                }
                if (ret < 0) {
                    VALID_ERR2(XML_RELAXNG_ERR_ELEMWRONG, cur->name);
                }
                break;
            default:
                break;
        }
        if (ret < 0)
            break;
        /*
         * Switch to next element
         */
        cur = cur->next;
    }
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 1) {
        ret = 0;
        ctxt->state->seq = NULL;
    } else if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
        if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
            xmlRelaxNGDumpValidError(ctxt);
    } else {
        ret = -1;
    }
    xmlRegFreeExecCtxt(exec);
    /*
     * There might be content model errors outside of the pure
     * regexp validation, e.g. for attribute values.
     */
    if ((ret == 0) && (ctxt->perr != 0)) {
        ret = ctxt->perr;
    }
    ctxt->perr = oldperr;
    return (ret);
}